

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall smf::Options::xverify(Options *this,int error_check,int suppress)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  char *pcVar7;
  int local_2c [2];
  int running;
  int position;
  int oldgargp;
  int optionend;
  int gargp;
  int suppress_local;
  int error_check_local;
  Options *this_local;
  
  this->m_options_error_check = error_check;
  oldgargp = 1;
  position = 0;
  if (suppress == 0) {
    this->m_suppressQ = false;
  }
  else {
    this->m_suppressQ = true;
  }
  optionend = suppress;
  gargp = error_check;
  _suppress_local = this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_argument);
  if (sVar4 != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->m_argument);
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->m_oargv,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_argument,pvVar5);
  local_2c[1] = 0;
  local_2c[0] = 0;
LAB_001388e1:
  do {
    if (this->m_oargc <= oldgargp || position != 0) {
LAB_00138a46:
      for (; oldgargp < this->m_oargc; oldgargp = oldgargp + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->m_oargv,(long)oldgargp);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_argument,pvVar5);
      }
      return;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)oldgargp);
    iVar3 = optionQ(this,pvVar5,&oldgargp);
    if (iVar3 != 0) {
      running = oldgargp;
      oldgargp = storeOption(this,oldgargp,local_2c + 1,local_2c);
      if (oldgargp != running) {
        local_2c[0] = 0;
        local_2c[1] = 0;
      }
      goto LAB_001388e1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->m_oargv,(long)oldgargp);
    lVar6 = std::__cxx11::string::size();
    if (lVar6 == 2) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_oargv,(long)oldgargp);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar5);
      cVar1 = *pcVar7;
      cVar2 = getFlag(this);
      if (cVar1 == cVar2) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->m_oargv,(long)oldgargp);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar5);
        cVar1 = *pcVar7;
        cVar2 = getFlag(this);
        if (cVar1 == cVar2) {
          position = 1;
          oldgargp = oldgargp + 1;
          goto LAB_00138a46;
        }
      }
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)oldgargp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_argument,pvVar5);
    oldgargp = oldgargp + 1;
  } while( true );
}

Assistant:

void Options::xverify(int error_check, int suppress) {
	m_options_error_check = error_check;
	int gargp = 1;
	int optionend = 0;

	if (suppress) {
		m_suppressQ = 1;
	} else {
		m_suppressQ = 0;
	}

	// if calling xverify again, must remove previous argument list.
	if (m_argument.size() != 0) {
		m_argument.clear();
	}

	m_argument.push_back(m_oargv[0]);
	int oldgargp;
	int position = 0;
	int running = 0;
	while (gargp < m_oargc && optionend == 0) {
		if (optionQ(m_oargv[gargp], gargp)) {
			oldgargp = gargp;
			gargp = storeOption(gargp, position, running);
			if (gargp != oldgargp) {
				running = 0;
				position = 0;
			}
		} else {
			if (m_oargv[gargp].size() == 2 && m_oargv[gargp][0] == getFlag() &&
				m_oargv[gargp][2] == getFlag() ) {
					optionend = 1;
				gargp++;
				break;
			} else {                          // this is an argument
				m_argument.push_back(m_oargv[gargp]);
				gargp++;
			}
		}
	}

	while (gargp < m_oargc) {
		m_argument.push_back(m_oargv[gargp]);
		gargp++;
	}

}